

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O3

FArchive * __thiscall FArchive::operator<<(FArchive *this,FName *n)

{
  int iVar1;
  char *text;
  
  if (this->m_Storing == true) {
    WriteName(this,FName::NameData.NameArray[n->Index].Text);
  }
  else {
    text = ReadName(this);
    iVar1 = FName::NameManager::FindName(&FName::NameData,text,false);
    n->Index = iVar1;
  }
  return this;
}

Assistant:

FArchive &FArchive::operator<< (FName &n)
{ // In an archive, a "name" is a string that might be stored multiple times,
  // so it is only stored once. It is still treated as a normal string. In the
  // rest of the game, a name is a unique identifier for a number.
	if (m_Storing)
	{
		WriteName (n.GetChars());
	}
	else
	{
		n = FName(ReadName());
	}
	return *this;
}